

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void __thiscall Fl_Widget_Type::resizable(Fl_Widget_Type *this,uchar v)

{
  uchar uVar1;
  int iVar2;
  Fl_Group *pFVar3;
  Fl_Group *p_1;
  Fl_Group *p;
  uchar v_local;
  Fl_Widget_Type *this_local;
  
  if (v == '\0') {
    uVar1 = resizable(this);
    if (uVar1 != '\0') {
      iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])();
      if (iVar2 == 0) {
        pFVar3 = Fl_Widget::parent(this->o);
        if (pFVar3 != (Fl_Group *)0x0) {
          Fl_Group::resizable(pFVar3,(Fl_Widget *)0x0);
        }
      }
      else {
        Fl_Group::resizable((Fl_Group *)this->o,(Fl_Widget *)0x0);
      }
    }
  }
  else {
    uVar1 = resizable(this);
    if (uVar1 == '\0') {
      iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])();
      if (iVar2 == 0) {
        pFVar3 = Fl_Widget::parent(this->o);
        if (pFVar3 != (Fl_Group *)0x0) {
          Fl_Group::resizable(pFVar3,this->o);
        }
      }
      else {
        Fl_Group::resizable((Fl_Group *)this->o,this->o);
      }
    }
  }
  return;
}

Assistant:

void Fl_Widget_Type::resizable(uchar v) {
  if (v) {
    if (resizable()) return;
    if (is_window()) ((Fl_Window*)o)->resizable(o);
    else {
      Fl_Group* p = (Fl_Group*)o->parent();
      if (p) p->resizable(o);
    }
  } else {
    if (!resizable()) return;
    if (is_window()) {
      ((Fl_Window*)o)->resizable(0);
    } else {
      Fl_Group* p = (Fl_Group*)o->parent();
      if (p) p->resizable(0);
    }
  }
}